

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.cpp
# Opt level: O0

void __thiscall net_uv::UVLoop::alloc_buf(UVLoop *this,uv_buf_t *buf,size_t size)

{
  bool bVar1;
  pointer puVar2;
  char *pcVar3;
  const_iterator local_38;
  _Self local_30;
  _Self local_28;
  iterator it;
  size_t size_local;
  uv_buf_t *buf_local;
  UVLoop *this_local;
  
  it._M_node = (_List_node_base *)size;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<uv_buf_t,_std::allocator<uv_buf_t>_>::begin(&this->m_freeReadBufList);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<uv_buf_t,_std::allocator<uv_buf_t>_>::end(&this->m_freeReadBufList);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      pcVar3 = (char *)malloc((size_t)it._M_node);
      buf->base = pcVar3;
      buf->len = (size_t)it._M_node;
      return;
    }
    puVar2 = std::_List_iterator<uv_buf_t>::operator->(&local_28);
    if ((_List_node_base *)puVar2->len == it._M_node) break;
    std::_List_iterator<uv_buf_t>::operator++(&local_28);
  }
  puVar2 = std::_List_iterator<uv_buf_t>::operator->(&local_28);
  buf->base = puVar2->base;
  puVar2 = std::_List_iterator<uv_buf_t>::operator->(&local_28);
  buf->len = puVar2->len;
  std::_List_const_iterator<uv_buf_t>::_List_const_iterator(&local_38,&local_28);
  std::__cxx11::list<uv_buf_t,_std::allocator<uv_buf_t>_>::erase(&this->m_freeReadBufList,local_38);
  return;
}

Assistant:

void UVLoop::alloc_buf(uv_buf_t* buf, size_t size)
{
	for (auto it = m_freeReadBufList.begin(); it != m_freeReadBufList.end(); ++it)
	{
		if (it->len == size)
		{
			buf->base = it->base;
			buf->len = it->len;
			m_freeReadBufList.erase(it);
			return;
		}
	}

	buf->base = (char*)fc_malloc(size);
	buf->len = size;
}